

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense.hpp
# Opt level: O3

void remora::bindings::
     pack_B_dense<remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>>
               (long *B,long p)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  
  uVar2 = B[2];
  uVar1 = uVar2 + 5;
  if (5 < uVar1) {
    lVar5 = *B;
    lVar3 = B[1];
    lVar4 = B[3];
    lVar7 = 0;
    uVar8 = 0;
    lVar10 = 0;
    do {
      if (lVar3 != 0) {
        lVar6 = 0;
        lVar9 = lVar5;
        do {
          lVar11 = lVar10;
          lVar10 = 0;
          do {
            uVar12 = 0;
            if ((ulong)(lVar7 + lVar10) < uVar2) {
              uVar12 = *(undefined8 *)(lVar9 + lVar10 * 8);
            }
            *(undefined8 *)(p + lVar11 * 8 + lVar10 * 8) = uVar12;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 6);
          lVar6 = lVar6 + 1;
          lVar9 = lVar9 + lVar4 * 8;
          lVar10 = lVar11 + 6;
        } while (lVar6 != lVar3);
        lVar10 = lVar11 + 6;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 6;
      lVar5 = lVar5 + 0x30;
    } while (uVar8 != uVar1 / 6);
  }
  return;
}

Assistant:

size_type size2() const {
		return m_size2;
	}